

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceVisitor.hpp
# Opt level: O3

void __thiscall netlist::InstanceVisitor::handle(InstanceVisitor *this,InstanceSymbol *symbol)

{
  int iVar1;
  string local_40;
  
  slang::ast::Symbol::getHierarchicalPath_abi_cxx11_(&local_40,(Symbol *)symbol);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_40,"$unit");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (iVar1 != 0) {
    handleInstanceMemberVars(this,symbol);
    handleInstanceMemberPorts(this,symbol);
    handleInstanceExtPorts(this,symbol);
    slang::ast::Symbol::visit<netlist::InstanceVisitor&>(&symbol->body->super_Symbol,this);
  }
  return;
}

Assistant:

void handle(const ast::InstanceSymbol& symbol) {
        DEBUG_PRINT("Instance: {}\n", symbol.getHierarchicalPath());

        if (symbol.getHierarchicalPath() == "$unit") {
            // An instance without a name has been excluded from the design.
            // This can happen when the --top option is used and there is an
            // uninstanced module.
            return;
        }

        handleInstanceMemberVars(symbol);
        handleInstanceMemberPorts(symbol);
        handleInstanceExtPorts(symbol);

        symbol.body.visit(*this);
    }